

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateArrayIndex(ExpressionEvalContext *ctx,ExprArrayIndex *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  int iVar6;
  longlong in_RAX;
  StackFrame **ppSVar7;
  undefined4 extraout_var;
  ExprMemoryLiteral *memory;
  ExprBase *pEVar8;
  TypeRef *pTVar9;
  ExprBase *pEVar10;
  ExprPointerLiteral *this;
  undefined4 extraout_var_01;
  char *msg;
  _func_int ***ptr;
  _func_int **pp_Var11;
  longlong result;
  undefined4 extraout_var_00;
  
  result = in_RAX;
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar7)->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar3;
    pEVar8->type = pTVar4;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
    return pEVar8;
  }
  bVar5 = AddInstruction(ctx);
  if (((!bVar5) ||
      (memory = (ExprMemoryLiteral *)Evaluate(ctx,expression->value),
      memory == (ExprMemoryLiteral *)0x0)) ||
     (pEVar8 = Evaluate(ctx,expression->index), pEVar8 == (ExprBase *)0x0)) {
    return (ExprBase *)0x0;
  }
  bVar5 = TryTakeLong(pEVar8,&result);
  if (bVar5) {
    pTVar4 = (memory->super_ExprBase).type;
    if (pTVar4 == (TypeBase *)0x0) {
LAB_001353bb:
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x66d,"ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                   );
    }
    if (pTVar4->typeID == 0x12) {
      pp_Var11 = pTVar4[1]._vptr_TypeBase;
      if ((pp_Var11 == (_func_int **)0x0) || (*(int *)(pp_Var11 + 1) != 0x13)) {
        __assert_fail("arrayType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x671,
                      "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
      }
      uVar1 = (memory->super_ExprBase).typeID;
      if (uVar1 != 9) {
        if ((result < 0) || ((long)pp_Var11[0xd] <= result)) {
LAB_001353a2:
          ReportCritical(ctx,"ERROR: array index out of bounds");
          return (ExprBase *)0x0;
        }
        if (uVar1 != 0xc) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x67b,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        ptr = (_func_int ***)
              ((long)&(memory->ptr->super_ExprBase)._vptr_ExprBase +
              result * *(long *)(pp_Var11[0xc] + 0x30));
        if (memory[1].super_ExprBase._vptr_ExprBase <
            (_func_int **)((long)ptr + *(long *)(pp_Var11[0xc] + 0x30))) {
          __assert_fail("ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x67c,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        pAVar2 = ctx->ctx->allocator;
        iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_01,iVar6);
        pSVar3 = (expression->super_ExprBase).source;
        pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,(TypeBase *)pp_Var11[0xc]);
        ExprPointerLiteral::ExprPointerLiteral
                  (this,pSVar3,&pTVar9->super_TypeBase,(uchar *)ptr,
                   (uchar *)((long)ptr + *(long *)(pp_Var11[0xc] + 0x30)));
LAB_00135395:
        pEVar8 = CheckType(&expression->super_ExprBase,&this->super_ExprBase);
        return pEVar8;
      }
    }
    else {
      if (pTVar4->typeID != 0x14) goto LAB_001353bb;
      if ((memory->super_ExprBase).typeID != 0xd) {
        __assert_fail("memory",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x64e,
                      "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
      }
      pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,*(TypeBase **)&pTVar4[1].typeIndex);
      pEVar8 = CreateExtract(ctx,memory,0,&pTVar9->super_TypeBase);
      if (pEVar8 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      if (pEVar8->typeID != 9) {
        pEVar10 = CreateExtract(ctx,memory,8,ctx->ctx->typeInt);
        if (pEVar10 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        if (pEVar10->typeID != 6) {
          return (ExprBase *)0x0;
        }
        if ((result < 0) || ((long)pEVar10[1]._vptr_ExprBase <= result)) goto LAB_001353a2;
        if (pEVar8->typeID != 0xc) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x662,
                        "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)");
        }
        pp_Var11 = (_func_int **)
                   (result * *(long *)(*(long *)&pTVar4[1].typeIndex + 0x30) +
                   (long)pEVar8[1]._vptr_ExprBase);
        pAVar2 = ctx->ctx->allocator;
        iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar6);
        pSVar3 = (expression->super_ExprBase).source;
        pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,*(TypeBase **)&pTVar4[1].typeIndex);
        ExprPointerLiteral::ExprPointerLiteral
                  (this,pSVar3,&pTVar9->super_TypeBase,(uchar *)pp_Var11,
                   (uchar *)((long)pp_Var11 + *(long *)(*(long *)&pTVar4[1].typeIndex + 0x30)));
        goto LAB_00135395;
      }
    }
    msg = "ERROR: array index of a null array";
  }
  else {
    msg = "ERROR: failed to evaluate array index";
  }
  Report(ctx,msg);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateArrayIndex(ExpressionEvalContext &ctx, ExprArrayIndex *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	ExprBase *index = Evaluate(ctx, expression->index);

	if(!index)
		return NULL;

	long long result;
	if(!TryTakeLong(index, result))
		return Report(ctx, "ERROR: failed to evaluate array index");

	if(TypeUnsizedArray *arrayType = getType<TypeUnsizedArray>(value->type))
	{
		ExprMemoryLiteral *memory = getType<ExprMemoryLiteral>(value);

		assert(memory);

		ExprBase *value = CreateExtract(ctx, memory, 0, ctx.ctx.GetReferenceType(arrayType->subType));

		if(!value)
			return NULL;

		if(isType<ExprNullptrLiteral>(value))
			return Report(ctx, "ERROR: array index of a null array");

		ExprIntegerLiteral *size = getType<ExprIntegerLiteral>(CreateExtract(ctx, memory, sizeof(void*), ctx.ctx.typeInt));

		if(!size)
			return NULL;

		if(result < 0 || result >= size->value)
			return ReportCritical(ctx, "ERROR: array index out of bounds");

		ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

		assert(ptr);

		unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		return CheckType(expression, shifted);
	}

	TypeRef *refType = getType<TypeRef>(value->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: array index of a null array");

	if(result < 0 || result >= arrayType->length)
		return ReportCritical(ctx, "ERROR: array index out of bounds");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

	return CheckType(expression, shifted);
}